

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationMultiQueueTests.cpp
# Opt level: O3

void __thiscall
vkt::synchronization::anon_unknown_2::BaseTestInstance::BaseTestInstance
          (BaseTestInstance *this,Context *context,ResourceDescription *resourceDesc,
          OperationSupport *writeOp,OperationSupport *readOp,PipelineCacheData *pipelineCacheData)

{
  UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *this_00;
  _Rb_tree_node_base *p_Var1;
  VkDevice device;
  DeviceInterface *vk;
  SimpleAllocator *pSVar2;
  uint uVar3;
  VkDevice_s *pVVar4;
  DestroyDeviceFunc p_Var5;
  VkAllocationCallbacks *pVVar6;
  BaseTestInstance *pBVar7;
  int i;
  InstanceInterface *pIVar8;
  InstanceInterface *vk_00;
  mapped_type *pmVar9;
  _Rb_tree_node_base *p_Var10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  DeviceDriver *this_01;
  SimpleAllocator *this_02;
  OperationContext *this_03;
  pointer pbVar12;
  ulong uVar13;
  long lVar14;
  _Base_ptr p_Var15;
  uint uVar16;
  ulong uVar17;
  Context *pCVar18;
  vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_> queueInfos;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
  queueFamilyProperties;
  vector<const_char_*,_std::allocator<const_char_*>_> charDevExtensions;
  float queuePriorities [2];
  VkDeviceCreateInfo deviceInfo;
  VkDeviceQueueCreateInfo queueInfo;
  VkDeviceQueueCreateInfo *local_328;
  iterator iStack_320;
  VkDeviceQueueCreateInfo *local_318;
  Context *local_310;
  Move<vk::VkDevice_s_*> local_308;
  BaseTestInstance *local_2f0;
  VkPhysicalDevice local_2e8;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> local_2e0;
  char **local_2c8;
  undefined8 uStack_2c0;
  long local_2b8;
  ResourceDescription *local_2a8;
  Resource *local_2a0;
  OperationSupport *local_298;
  PipelineCacheData *local_290;
  undefined8 local_288;
  VkDeviceCreateInfo local_280;
  undefined1 local_238 [16];
  VkAllocationCallbacks *pVStack_228;
  long lStack_220;
  float *local_218;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__BaseTestInstance_00d01b18;
  local_2f0 = this;
  local_290 = pipelineCacheData;
  pIVar8 = (InstanceInterface *)operator_new(0x68);
  this_00 = (UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *)(pIVar8 + 3);
  pIVar8[5]._vptr_InstanceInterface = (_func_int **)0x0;
  p_Var1 = (_Rb_tree_node_base *)(pIVar8 + 8);
  *(undefined4 *)&pIVar8[8]._vptr_InstanceInterface = 0;
  pIVar8[9]._vptr_InstanceInterface = (_func_int **)0x0;
  pIVar8->_vptr_InstanceInterface = (_func_int **)0x0;
  pIVar8[1]._vptr_InstanceInterface = (_func_int **)0x0;
  pIVar8[2]._vptr_InstanceInterface = (_func_int **)0x0;
  pIVar8[3]._vptr_InstanceInterface = (_func_int **)0x0;
  pIVar8[10]._vptr_InstanceInterface = (_func_int **)p_Var1;
  pIVar8[0xb]._vptr_InstanceInterface = (_func_int **)p_Var1;
  pIVar8[0xc]._vptr_InstanceInterface = (_func_int **)0x0;
  vk_00 = Context::getInstanceInterface(context);
  local_310 = context;
  local_2e8 = Context::getPhysicalDevice(context);
  local_2a8 = resourceDesc;
  local_2a0 = (Resource *)writeOp;
  local_298 = readOp;
  ::vk::getPhysicalDeviceQueueFamilyProperties(&local_2e0,vk_00,local_2e8);
  if (local_2e0.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_2e0.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar16 = 1;
    uVar17 = 0;
    do {
      local_280.sType = uVar16 - VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
      uVar3 = local_2e0.
              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar17].queueCount;
      if (1 < local_2e0.
              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar17].queueCount) {
        uVar3 = 2;
      }
      local_238._8_8_ = (void *)0x0;
      pVStack_228 = (VkAllocationCallbacks *)0x0;
      lStack_220 = 0;
      local_238._0_4_ =
           local_2e0.
           super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar17].queueFlags;
      std::vector<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>::resize
                ((vector<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_> *)(local_238 + 8),
                 (ulong)uVar3);
      pmVar9 = std::
               map<unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueData>_>_>
               ::operator[]((map<unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueData>_>_>
                             *)(pIVar8 + 7),&local_280.sType);
      pmVar9->flags = local_238._0_4_;
      std::vector<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>::operator=
                (&pmVar9->queue,
                 (vector<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_> *)(local_238 + 8));
      if ((void *)local_238._8_8_ != (void *)0x0) {
        operator_delete((void *)local_238._8_8_,lStack_220 - local_238._8_8_);
      }
      uVar17 = (ulong)uVar16;
      uVar13 = ((long)local_2e0.
                      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_2e0.
                      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      uVar16 = uVar16 + 1;
    } while (uVar17 <= uVar13 && uVar13 - uVar17 != 0);
  }
  local_328 = (VkDeviceQueueCreateInfo *)0x0;
  iStack_320._M_current = (VkDeviceQueueCreateInfo *)0x0;
  local_318 = (VkDeviceQueueCreateInfo *)0x0;
  local_288 = 0x3f8000003f800000;
  p_Var10 = (_Rb_tree_node_base *)pIVar8[10]._vptr_InstanceInterface;
  if (p_Var10 != p_Var1) {
    do {
      local_238._0_4_ = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
      local_238._8_8_ = (void *)0x0;
      pVStack_228 = (VkAllocationCallbacks *)((ulong)p_Var10[1]._M_color << 0x20);
      lStack_220 = CONCAT44(lStack_220._4_4_,
                            (int)((ulong)((long)p_Var10[1]._M_right - (long)p_Var10[1]._M_left) >> 3
                                 ));
      local_218 = (float *)&local_288;
      if (iStack_320._M_current == local_318) {
        std::vector<vk::VkDeviceQueueCreateInfo,std::allocator<vk::VkDeviceQueueCreateInfo>>::
        _M_realloc_insert<vk::VkDeviceQueueCreateInfo_const&>
                  ((vector<vk::VkDeviceQueueCreateInfo,std::allocator<vk::VkDeviceQueueCreateInfo>>
                    *)&local_328,iStack_320,(VkDeviceQueueCreateInfo *)local_238);
      }
      else {
        (iStack_320._M_current)->pQueuePriorities = (float *)&local_288;
        *(VkAllocationCallbacks **)&(iStack_320._M_current)->flags = pVStack_228;
        *(long *)&(iStack_320._M_current)->queueCount = lStack_220;
        *(undefined8 *)iStack_320._M_current = local_238._0_8_;
        (iStack_320._M_current)->pNext = (void *)0x0;
        iStack_320._M_current = iStack_320._M_current + 1;
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != p_Var1);
  }
  pCVar18 = local_310;
  pvVar11 = Context::getDeviceExtensions_abi_cxx11_(local_310);
  local_2c8 = (char **)0x0;
  uStack_2c0 = 0;
  local_2b8 = 0;
  pbVar12 = (pvVar11->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar11->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar12) {
    local_280.enabledExtensionCount = 0;
  }
  else {
    lVar14 = 0;
    uVar17 = 0;
    do {
      local_238._0_8_ = *(undefined8 *)((long)&(pbVar12->_M_dataplus)._M_p + lVar14);
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_2c8,(char **)local_238);
      uVar17 = uVar17 + 1;
      pbVar12 = (pvVar11->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (long)(pvVar11->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12;
      lVar14 = lVar14 + 0x20;
    } while (uVar17 < (ulong)((long)uVar13 >> 5));
    local_280.enabledExtensionCount = (deUint32)(uVar13 >> 5);
    pCVar18 = local_310;
  }
  local_280.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  local_280.pNext = (void *)0x0;
  local_280.flags = 0;
  local_280.queueCreateInfoCount =
       (int)((ulong)((long)iStack_320._M_current - (long)local_328) >> 3) * -0x33333333;
  local_280.pQueueCreateInfos = local_328;
  local_280.enabledLayerCount = 0;
  local_280.ppEnabledLayerNames = (char **)0x0;
  local_280.ppEnabledExtensionNames = local_2c8;
  local_280.pEnabledFeatures = Context::getDeviceFeatures(pCVar18);
  ::vk::createDevice(&local_308,vk_00,local_2e8,&local_280,(VkAllocationCallbacks *)0x0);
  pVVar6 = local_308.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
  p_Var5 = local_308.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
  pVVar4 = local_308.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  pVStack_228 = local_308.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
  local_238._0_8_ = local_308.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  local_238._8_8_ = local_308.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
  local_308.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice)0x0;
  local_308.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_308.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (pIVar8->_vptr_InstanceInterface == (_func_int **)0x0) {
    pIVar8[2]._vptr_InstanceInterface = (_func_int **)pVVar6;
    pIVar8->_vptr_InstanceInterface = (_func_int **)pVVar4;
    pIVar8[1]._vptr_InstanceInterface = (_func_int **)p_Var5;
  }
  else {
    (*(code *)pIVar8[1]._vptr_InstanceInterface)
              (pIVar8->_vptr_InstanceInterface,pIVar8[2]._vptr_InstanceInterface);
    pIVar8[2]._vptr_InstanceInterface = (_func_int **)pVStack_228;
    pIVar8->_vptr_InstanceInterface = (_func_int **)local_238._0_8_;
    pIVar8[1]._vptr_InstanceInterface = (_func_int **)local_238._8_8_;
    if (local_308.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
      (*local_308.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                (local_308.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 local_308.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
    }
  }
  this_01 = (DeviceDriver *)operator_new(0x4b8);
  ::vk::DeviceDriver::DeviceDriver(this_01,vk_00,(VkDevice)pIVar8->_vptr_InstanceInterface);
  local_238._0_8_ = (DeviceDriver *)0x0;
  if ((this_00->m_data).ptr != this_01) {
    de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::reset(this_00)
    ;
    (this_00->m_data).ptr = this_01;
  }
  de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::reset
            ((UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *)local_238);
  this_02 = (SimpleAllocator *)operator_new(0x220);
  device = (VkDevice)pIVar8->_vptr_InstanceInterface;
  vk = (DeviceInterface *)pIVar8[3]._vptr_InstanceInterface;
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)local_238,vk_00,local_2e8);
  ::vk::SimpleAllocator::SimpleAllocator
            (this_02,vk,device,(VkPhysicalDeviceMemoryProperties *)local_238);
  pSVar2 = (SimpleAllocator *)pIVar8[5]._vptr_InstanceInterface;
  if (pSVar2 != this_02) {
    if (pSVar2 != (SimpleAllocator *)0x0) {
      (*(pSVar2->super_Allocator)._vptr_Allocator[1])();
    }
    pIVar8[5]._vptr_InstanceInterface = (_func_int **)this_02;
  }
  for (p_Var10 = (_Rb_tree_node_base *)pIVar8[10]._vptr_InstanceInterface; p_Var10 != p_Var1;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    p_Var15 = p_Var10[1]._M_left;
    if (0 < (int)((ulong)((long)p_Var10[1]._M_right - (long)p_Var15) >> 3)) {
      lVar14 = 0;
      uVar17 = 0;
      do {
        (**(code **)(*pIVar8[3]._vptr_InstanceInterface + 8))
                  (pIVar8[3]._vptr_InstanceInterface,pIVar8->_vptr_InstanceInterface,
                   p_Var10[1]._M_color,uVar17 & 0xffffffff,(long)&p_Var15->_M_color + lVar14);
        uVar17 = uVar17 + 1;
        p_Var15 = p_Var10[1]._M_left;
        lVar14 = lVar14 + 8;
      } while ((long)uVar17 < (long)(int)((ulong)((long)p_Var10[1]._M_right - (long)p_Var15) >> 3));
    }
  }
  if (local_2c8 != (char **)0x0) {
    operator_delete(local_2c8,local_2b8 - (long)local_2c8);
  }
  pBVar7 = local_2f0;
  pCVar18 = local_310;
  if (local_328 != (VkDeviceQueueCreateInfo *)0x0) {
    operator_delete(local_328,(long)local_318 - (long)local_328);
  }
  if (local_2e0.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.
                    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (pBVar7->m_opContext).m_vki = pIVar8;
  this_03 = (OperationContext *)operator_new(0x40);
  OperationContext::OperationContext
            (this_03,pCVar18,local_290,(DeviceInterface *)pIVar8[3]._vptr_InstanceInterface,
             (VkDevice)pIVar8->_vptr_InstanceInterface,
             (Allocator *)pIVar8[5]._vptr_InstanceInterface);
  (pBVar7->m_opContext).m_physicalDevice = (VkPhysicalDevice)this_03;
  *(ResourceType *)&(pBVar7->m_opContext).m_allocator = local_2a8->type;
  lVar14 = 0;
  do {
    *(int *)((long)&(pBVar7->m_opContext).m_allocator + lVar14 * 4 + 4) =
         (local_2a8->size).m_data[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  *(VkImageAspectFlags *)((long)&(pBVar7->m_opContext).m_deviceExtensions + 4) =
       local_2a8->imageAspect;
  *(undefined8 *)((long)&(pBVar7->m_opContext).m_pipelineCacheData + 4) =
       *(undefined8 *)&local_2a8->imageType;
  (pBVar7->m_resource).
  super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
  .m_data.ptr = local_2a0;
  *(OperationSupport **)
   &(pBVar7->m_resource).
    super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
    .m_data.field_0x8 = local_298;
  return;
}

Assistant:

BaseTestInstance (Context& context, const ResourceDescription& resourceDesc, const OperationSupport& writeOp, const OperationSupport& readOp, PipelineCacheData& pipelineCacheData)
		: TestInstance		(context)
		, m_queues			(new MultiQueues(context))
		, m_opContext		(new OperationContext(context, pipelineCacheData, m_queues->getDeviceInterface(), m_queues->getDevice(), m_queues->getAllocator()))
		, m_resourceDesc	(resourceDesc)
		, m_writeOp			(writeOp)
		, m_readOp			(readOp)
	{
	}